

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O3

void __thiscall
Renderer::Renderer(Renderer *this,size_t screen_width,size_t screen_height,size_t grid_width,
                  size_t grid_height)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  SDL_Window *pSVar4;
  SDL_Renderer *pSVar5;
  
  this->screen_width = screen_width;
  this->screen_height = screen_height;
  this->grid_width = grid_width;
  this->grid_height = grid_height;
  iVar1 = SDL_Init(0x20);
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"SDL could not initialize.\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"SDL_Error: ",0xb);
    pcVar2 = (char *)SDL_GetError();
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x109200);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  pSVar4 = (SDL_Window *)
           SDL_CreateWindow("Snake Game",0x2fff0000,0x2fff0000,screen_width & 0xffffffff,
                            screen_height & 0xffffffff,4);
  this->sdl_window = pSVar4;
  if (pSVar4 == (SDL_Window *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Window could not be created.\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," SDL_Error: ",0xc);
    pcVar2 = (char *)SDL_GetError();
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x109200);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    pSVar4 = this->sdl_window;
  }
  pSVar5 = (SDL_Renderer *)SDL_CreateRenderer(pSVar4,0xffffffff,2);
  this->sdl_renderer = pSVar5;
  if (pSVar5 != (SDL_Renderer *)0x0) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Renderer could not be created.\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"SDL_Error: ",0xb);
  pcVar2 = (char *)SDL_GetError();
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x109200);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  return;
}

Assistant:

Renderer::Renderer(const std::size_t screen_width,
                   const std::size_t screen_height,
                   const std::size_t grid_width, const std::size_t grid_height)
    : screen_width(screen_width),
      screen_height(screen_height),
      grid_width(grid_width),
      grid_height(grid_height) {
    // Initialize SDL
    if (SDL_Init(SDL_INIT_VIDEO) < 0) {
        std::cerr << "SDL could not initialize.\n";
        std::cerr << "SDL_Error: " << SDL_GetError() << "\n";
    }

    // Create Window
    sdl_window = SDL_CreateWindow("Snake Game", SDL_WINDOWPOS_CENTERED,
                                  SDL_WINDOWPOS_CENTERED, screen_width,
                                  screen_height, SDL_WINDOW_SHOWN);

    if (nullptr == sdl_window) {
        std::cerr << "Window could not be created.\n";
        std::cerr << " SDL_Error: " << SDL_GetError() << "\n";
    }

    // Create renderer
    sdl_renderer = SDL_CreateRenderer(sdl_window, -1, SDL_RENDERER_ACCELERATED);
    if (nullptr == sdl_renderer) {
        std::cerr << "Renderer could not be created.\n";
        std::cerr << "SDL_Error: " << SDL_GetError() << "\n";
    }
}